

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLib.c
# Opt level: O1

JL_STATUS JlStructToJsonEx(void *Structure,JlMarshallElement *StructDescription,
                          size_t StructDescriptionCount,JL_OUTPUT_FLAGS OutputFlags,
                          char **pJsonStringBuffer)

{
  JL_STATUS JVar1;
  JlDataObject *objectTree;
  JlDataObject *local_28;
  
  JVar1 = JL_STATUS_INVALID_PARAMETER;
  if ((pJsonStringBuffer != (char **)0x0 && StructDescriptionCount != 0) &&
      (StructDescription != (JlMarshallElement *)0x0 && Structure != (void *)0x0)) {
    local_28 = (JlDataObject *)0x0;
    *pJsonStringBuffer = (char *)0x0;
    JVar1 = JlMarshallFromStructToNewDataObject
                      (Structure,StructDescription,StructDescriptionCount,&local_28);
    if (JVar1 == JL_STATUS_SUCCESS) {
      JVar1 = JlOutputJsonEx(local_28,OutputFlags,pJsonStringBuffer);
      JlFreeObjectTree(&local_28);
    }
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlStructToJsonEx
    (
        void const*                 Structure,                      // [in]
        JlMarshallElement const*    StructDescription,              // [in]
        size_t                      StructDescriptionCount,         // [in]
        JL_OUTPUT_FLAGS             OutputFlags,                    // [in]
        char**                      pJsonStringBuffer               // [out]
    )
{
    JL_STATUS jlStatus;

    if(     NULL != Structure
        &&  NULL != StructDescription
        &&  0 != StructDescriptionCount
        &&  NULL != pJsonStringBuffer )
    {
        JlDataObject* objectTree = NULL;

        *pJsonStringBuffer = NULL;

        jlStatus = JlMarshallFromStructToNewDataObject( Structure, StructDescription, StructDescriptionCount, &objectTree );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlOutputJsonEx( objectTree, OutputFlags, pJsonStringBuffer );

            // Now free the intermediate objectTree regardless of whether the unmarshall succeeded.
            (void) JlFreeObjectTree( &objectTree );
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}